

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double uniform_discrete_cdf(int x,int a,int b)

{
  undefined8 local_20;
  double cdf;
  int b_local;
  int a_local;
  int x_local;
  
  if (x < a) {
    local_20 = 0.0;
  }
  else if (b < x) {
    local_20 = 1.0;
  }
  else {
    local_20 = (double)((x + 1) - a) / (double)((b + 1) - a);
  }
  return local_20;
}

Assistant:

double uniform_discrete_cdf ( int x, int a, int b )

//****************************************************************************80
//
//  Purpose:
//
//    UNIFORM_DISCRETE_CDF evaluates the Uniform Discrete CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    17 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int X, the argument of the CDF.
//
//    Input, int A, B, the parameters of the PDF.
//    A <= B.
//
//    Output, double UNIFORM_DISCRETE_CDF, the value of the CDF.
//
{
  double cdf;

  if ( x < a )
  {
    cdf = 0.0;
  }
  else if ( b < x )
  {
    cdf = 1.0;
  }
  else
  {
    cdf = static_cast<double>(x + 1 - a ) / static_cast<double>(b + 1 - a );
  }

  return cdf;
}